

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

void deqp::gls::generateUniformDeclarations(ostream *dst,ValueBlock *valueBlock)

{
  DataType dataType;
  Value *pVVar1;
  const_reference this;
  char *pcVar2;
  long lVar3;
  ostream *poVar4;
  char *typeStr;
  Value *val;
  size_t ndx;
  ValueBlock *valueBlock_local;
  ostream *dst_local;
  
  val = (Value *)0x0;
  while( true ) {
    pVVar1 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                (&valueBlock->uniforms);
    if (pVVar1 <= val) break;
    this = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                     (&valueBlock->uniforms,(size_type)val);
    dataType = glu::VarType::getBasicType(&this->type);
    pcVar2 = glu::getDataTypeName(dataType);
    lVar3 = std::__cxx11::string::find((char)this + '\x18',0x2e);
    if (lVar3 == -1) {
      poVar4 = std::operator<<(dst,"uniform ");
      poVar4 = std::operator<<(poVar4,pcVar2);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,(string *)&this->name);
      std::operator<<(poVar4,";\n");
    }
    val = (Value *)((long)&(val->type).m_type + 1);
  }
  return;
}

Assistant:

static void generateUniformDeclarations (std::ostream& dst, const ValueBlock& valueBlock)
{
	for (size_t ndx = 0; ndx < valueBlock.uniforms.size(); ndx++)
	{
		const Value&		val		= valueBlock.uniforms[ndx];
		const char* const	typeStr	= getDataTypeName(val.type.getBasicType());

		if (val.name.find('.') == string::npos)
			dst << "uniform " << typeStr << " " << val.name << ";\n";
	}
}